

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::coordinatesToIndexTest<true>(ViewTest *this)

{
  ulong *puVar1;
  ulong uVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  size_t sVar4;
  allocator_type local_a1;
  size_t index;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 4;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  index = CONCAT44(index._4_4_,1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,(CoordinateOrder *)&c,
             (CoordinateOrder *)&index,&local_a1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&c,3,(allocator_type *)&index);
  _Var3._M_current =
       (unsigned_long *)
       CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  _Var3._M_current[2] = 0;
  uVar2 = 0;
  sVar4 = 0;
  puVar1 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (uVar2 < puVar1[2]) {
    _Var3._M_current[1] = 0;
    uVar2 = 0;
    while (uVar2 < puVar1[1]) {
      *_Var3._M_current = 0;
      uVar2 = *_Var3._M_current;
      while (uVar2 < *puVar1) {
        index = 100;
        andres::View<int,true,std::allocator<unsigned_long>>::
        coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)&v,_Var3,&index);
        local_a1 = (allocator_type)(sVar4 == index);
        test((bool *)&local_a1);
        sVar4 = sVar4 + 1;
        _Var3._M_current =
             (unsigned_long *)
             CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_);
        uVar2 = *_Var3._M_current + 1;
        *_Var3._M_current = uVar2;
        puVar1 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar2 = _Var3._M_current[1] + 1;
      _Var3._M_current[1] = uVar2;
    }
    uVar2 = _Var3._M_current[2] + 1;
    _Var3._M_current[2] = uVar2;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 4;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  index = index & 0xffffffff00000000;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,(CoordinateOrder *)&c,
             (CoordinateOrder *)&index,&local_a1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&c,3,(allocator_type *)&index);
  _Var3._M_current =
       (unsigned_long *)
       CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  *_Var3._M_current = 0;
  uVar2 = 0;
  sVar4 = 0;
  puVar1 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (uVar2 < *puVar1) {
    _Var3._M_current[1] = 0;
    uVar2 = 0;
    while (uVar2 < puVar1[1]) {
      _Var3._M_current[2] = 0;
      uVar2 = _Var3._M_current[2];
      while (uVar2 < puVar1[2]) {
        index = 100;
        andres::View<int,true,std::allocator<unsigned_long>>::
        coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)&v,_Var3,&index);
        local_a1 = (allocator_type)(sVar4 == index);
        test((bool *)&local_a1);
        sVar4 = sVar4 + 1;
        _Var3._M_current =
             (unsigned_long *)
             CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_);
        uVar2 = _Var3._M_current[2] + 1;
        _Var3._M_current[2] = uVar2;
        puVar1 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar2 = _Var3._M_current[1] + 1;
      _Var3._M_current[1] = uVar2;
    }
    uVar2 = *_Var3._M_current + 1;
    *_Var3._M_current = uVar2;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::coordinatesToIndexTest() {
    // internalFirstMajorOrder == false
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t trueIndex = 0;
        for(c[2]=0; c[2]<shape[2]; ++c[2]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[0]=0; c[0]<shape[0]; ++c[0]) {
            std::size_t index = 100;
            v.coordinatesToIndex(c.begin(), index);
            test(index == trueIndex);
            ++trueIndex;
        }
    }
    // internalFirstMajorOrder == true
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t trueIndex = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::size_t index = 100;
            v.coordinatesToIndex(c.begin(), index);
            test(index == trueIndex);
            ++trueIndex;
        }
    }
}